

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O0

void __thiscall btBoxShape::setMargin(btBoxShape *this,btScalar collisionMargin)

{
  btConvexInternalShape *in_RDI;
  btScalar in_XMM0_Da;
  btVector3 bVar1;
  btVector3 newMargin;
  btVector3 implicitShapeDimensionsWithMargin;
  btVector3 oldMargin;
  btVector3 *in_stack_ffffffffffffff88;
  btVector3 *this_00;
  undefined8 local_64;
  undefined8 local_5c;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  btScalar local_38 [4];
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  btVector3 local_1c;
  btScalar local_c;
  
  local_c = in_XMM0_Da;
  (*(in_RDI->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(in_RDI->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(in_RDI->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  btVector3::btVector3(&local_1c,&local_20,&local_24,&local_28);
  local_38 = (btScalar  [4])operator+((btVector3 *)in_RDI,in_stack_ffffffffffffff88);
  btConvexInternalShape::setMargin(in_RDI,local_c);
  (*(in_RDI->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(in_RDI->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(in_RDI->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  this_00 = &local_48;
  btVector3::btVector3(this_00,&local_4c,&local_50,&local_54);
  bVar1 = operator-((btVector3 *)in_RDI,this_00);
  local_64 = bVar1.m_floats._0_8_;
  *(undefined8 *)(in_RDI->m_implicitShapeDimensions).m_floats = local_64;
  local_5c = bVar1.m_floats._8_8_;
  *(undefined8 *)((in_RDI->m_implicitShapeDimensions).m_floats + 2) = local_5c;
  return;
}

Assistant:

virtual void setMargin(btScalar collisionMargin)
	{
		//correct the m_implicitShapeDimensions for the margin
		btVector3 oldMargin(getMargin(),getMargin(),getMargin());
		btVector3 implicitShapeDimensionsWithMargin = m_implicitShapeDimensions+oldMargin;
		
		btConvexInternalShape::setMargin(collisionMargin);
		btVector3 newMargin(getMargin(),getMargin(),getMargin());
		m_implicitShapeDimensions = implicitShapeDimensionsWithMargin - newMargin;

	}